

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::ProcessTransfers(BackwardPass *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  Opnd *pOVar3;
  StackSym *pSVar4;
  ObjectSymInfo *pOVar5;
  undefined4 *puVar6;
  byte local_b1;
  undefined1 local_88 [8];
  BVSparse<Memory::JitArenaAllocator> equivFields;
  PropertySym *srcPropertySym;
  StackSym *srcStackSym;
  undefined1 local_48 [8];
  BVSparse<Memory::JitArenaAllocator> transferFields;
  PropertySym *dstPropertySym;
  StackSym *dstStackSym;
  Instr *instr_local;
  BackwardPass *this_local;
  
  if (((this->tag == DeadStorePhase) &&
      (this->currentBlock->upwardExposedFields != (BVSparse<Memory::JitArenaAllocator> *)0x0)) &&
     (instr->m_opcode == Ld_A)) {
    pOVar3 = IR::Instr::GetDst(instr);
    pSVar4 = IR::Opnd::GetStackSym(pOVar3);
    if (pSVar4 != (StackSym *)0x0) {
      pOVar3 = IR::Instr::GetDst(instr);
      pSVar4 = IR::Opnd::GetStackSym(pOVar3);
      bVar2 = StackSym::IsTypeSpec(pSVar4);
      if (!bVar2) {
        pOVar3 = IR::Instr::GetDst(instr);
        pSVar4 = IR::Opnd::GetStackSym(pOVar3);
        bVar2 = StackSym::HasObjectInfo(pSVar4);
        if ((bVar2) && (pOVar3 = IR::Instr::GetSrc1(instr), pOVar3 != (Opnd *)0x0)) {
          pOVar3 = IR::Instr::GetSrc1(instr);
          pSVar4 = IR::Opnd::GetStackSym(pOVar3);
          if (pSVar4 != (StackSym *)0x0) {
            pOVar3 = IR::Instr::GetSrc1(instr);
            pSVar4 = IR::Opnd::GetStackSym(pOVar3);
            bVar2 = StackSym::IsTypeSpec(pSVar4);
            if (!bVar2) {
              pOVar3 = IR::Instr::GetSrc1(instr);
              pSVar4 = IR::Opnd::GetStackSym(pOVar3);
              bVar2 = StackSym::HasObjectInfo(pSVar4);
              if (bVar2) {
                pOVar3 = IR::Instr::GetDst(instr);
                pSVar4 = IR::Opnd::GetStackSym(pOVar3);
                pOVar5 = StackSym::GetObjectInfo(pSVar4);
                transferFields.lastUsedNodePrevNextField = (Type)pOVar5->m_propertySymList;
                BVSparse<Memory::JitArenaAllocator>::BVSparse
                          ((BVSparse<Memory::JitArenaAllocator> *)local_48,this->tempAlloc);
                for (; transferFields.lastUsedNodePrevNextField != (Type)0x0;
                    transferFields.lastUsedNodePrevNextField =
                         &transferFields.lastUsedNodePrevNextField[6]->next) {
                  if ((StackSym *)transferFields.lastUsedNodePrevNextField[4] != pSVar4) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar6 = 1;
                    bVar2 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                       ,0x1f98,"(dstPropertySym->m_stackSym == dstStackSym)",
                                       "dstPropertySym->m_stackSym == dstStackSym");
                    if (!bVar2) {
                      pcVar1 = (code *)invalidInstructionException();
                      (*pcVar1)();
                    }
                    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar6 = 0;
                  }
                  BVSparse<Memory::JitArenaAllocator>::Set
                            ((BVSparse<Memory::JitArenaAllocator> *)local_48,
                             *(BVIndex *)(transferFields.lastUsedNodePrevNextField + 2));
                }
                pOVar3 = IR::Instr::GetSrc1(instr);
                pSVar4 = IR::Opnd::GetStackSym(pOVar3);
                pOVar5 = StackSym::GetObjectInfo(pSVar4);
                equivFields.lastUsedNodePrevNextField = (Type)pOVar5->m_propertySymList;
                BVSparse<Memory::JitArenaAllocator>::BVSparse
                          ((BVSparse<Memory::JitArenaAllocator> *)local_88,this->tempAlloc);
                while( true ) {
                  local_b1 = 0;
                  if (equivFields.lastUsedNodePrevNextField != (Type)0x0) {
                    bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                                      ((BVSparse<Memory::JitArenaAllocator> *)local_48);
                    local_b1 = bVar2 ^ 0xff;
                  }
                  if ((local_b1 & 1) == 0) break;
                  if ((StackSym *)equivFields.lastUsedNodePrevNextField[4] != pSVar4) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar6 = 1;
                    bVar2 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                       ,0x1fa3,"(srcPropertySym->m_stackSym == srcStackSym)",
                                       "srcPropertySym->m_stackSym == srcStackSym");
                    if (!bVar2) {
                      pcVar1 = (code *)invalidInstructionException();
                      (*pcVar1)();
                    }
                    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar6 = 0;
                  }
                  if (equivFields.lastUsedNodePrevNextField[5] !=
                      (BVSparseNode<Memory::JitArenaAllocator> *)0x0) {
                    BVSparse<Memory::JitArenaAllocator>::And
                              ((BVSparse<Memory::JitArenaAllocator> *)local_88,
                               (BVSparse<Memory::JitArenaAllocator> *)local_48,
                               (BVSparse<Memory::JitArenaAllocator> *)
                               equivFields.lastUsedNodePrevNextField[5]);
                    bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                                      ((BVSparse<Memory::JitArenaAllocator> *)local_88);
                    if (!bVar2) {
                      BVSparse<Memory::JitArenaAllocator>::Minus
                                ((BVSparse<Memory::JitArenaAllocator> *)local_48,
                                 (BVSparse<Memory::JitArenaAllocator> *)local_88);
                      BVSparse<Memory::JitArenaAllocator>::Set
                                (this->currentBlock->upwardExposedFields,
                                 *(BVIndex *)(equivFields.lastUsedNodePrevNextField + 2));
                    }
                  }
                  equivFields.lastUsedNodePrevNextField =
                       &equivFields.lastUsedNodePrevNextField[6]->next;
                }
                BVSparse<Memory::JitArenaAllocator>::~BVSparse
                          ((BVSparse<Memory::JitArenaAllocator> *)local_88);
                BVSparse<Memory::JitArenaAllocator>::~BVSparse
                          ((BVSparse<Memory::JitArenaAllocator> *)local_48);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::ProcessTransfers(IR::Instr * instr)
{
    if (this->tag == Js::DeadStorePhase &&
        this->currentBlock->upwardExposedFields &&
        instr->m_opcode == Js::OpCode::Ld_A &&
        instr->GetDst()->GetStackSym() &&
        !instr->GetDst()->GetStackSym()->IsTypeSpec() &&
        instr->GetDst()->GetStackSym()->HasObjectInfo() &&
        instr->GetSrc1() &&
        instr->GetSrc1()->GetStackSym() &&
        !instr->GetSrc1()->GetStackSym()->IsTypeSpec() &&
        instr->GetSrc1()->GetStackSym()->HasObjectInfo())
    {
        StackSym * dstStackSym = instr->GetDst()->GetStackSym();
        PropertySym * dstPropertySym = dstStackSym->GetObjectInfo()->m_propertySymList;
        BVSparse<JitArenaAllocator> transferFields(this->tempAlloc);
        while (dstPropertySym != nullptr)
        {
            Assert(dstPropertySym->m_stackSym == dstStackSym);
            transferFields.Set(dstPropertySym->m_id);
            dstPropertySym = dstPropertySym->m_nextInStackSymList;
        }

        StackSym * srcStackSym = instr->GetSrc1()->GetStackSym();
        PropertySym * srcPropertySym = srcStackSym->GetObjectInfo()->m_propertySymList;
        BVSparse<JitArenaAllocator> equivFields(this->tempAlloc);

        while (srcPropertySym != nullptr && !transferFields.IsEmpty())
        {
            Assert(srcPropertySym->m_stackSym == srcStackSym);
            if (srcPropertySym->m_propertyEquivSet)
            {
                equivFields.And(&transferFields, srcPropertySym->m_propertyEquivSet);
                if (!equivFields.IsEmpty())
                {
                    transferFields.Minus(&equivFields);
                    this->currentBlock->upwardExposedFields->Set(srcPropertySym->m_id);
                }
            }
            srcPropertySym = srcPropertySym->m_nextInStackSymList;
        }
    }
}